

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::Array2Struct::visitArraySet(Array2Struct *this,ArraySet *curr)

{
  ParentChildInteraction PVar1;
  Block *expression;
  StructSet *expression_00;
  optional<wasm::Type> type;
  optional<wasm::Type> local_58;
  Drop *local_48;
  Drop *local_40;
  Unreachable *local_38;
  initializer_list<wasm::Expression_*> local_30;
  Index local_1c;
  ArraySet *pAStack_18;
  Index index;
  ArraySet *curr_local;
  Array2Struct *this_local;
  
  pAStack_18 = curr;
  curr_local = (ArraySet *)this;
  PVar1 = EscapeAnalyzer::getInteraction(this->analyzer,(Expression *)curr);
  if (PVar1 != None) {
    local_1c = getIndex(this,pAStack_18->index);
    if (local_1c < this->numFields) {
      expression_00 =
           Builder::makeStructSet
                     (&this->builder,local_1c,pAStack_18->ref,pAStack_18->value,Unordered);
      replaceCurrent(this,(Expression *)expression_00);
    }
    else {
      local_48 = Builder::makeDrop(&this->builder,pAStack_18->ref);
      local_40 = Builder::makeDrop(&this->builder,pAStack_18->value);
      local_38 = Builder::makeUnreachable(&this->builder);
      local_30._M_array = (iterator)&local_48;
      local_30._M_len = 3;
      std::optional<wasm::Type>::optional(&local_58);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_58.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_58.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      expression = Builder::makeBlock(&this->builder,&local_30,type);
      replaceCurrent(this,(Expression *)expression);
      this->refinalize = true;
    }
  }
  return;
}

Assistant:

void visitArraySet(ArraySet* curr) {
    if (analyzer.getInteraction(curr) == ParentChildInteraction::None) {
      return;
    }

    // If this is an OOB array.set then we trap.
    auto index = getIndex(curr->index);
    if (index >= numFields) {
      replaceCurrent(builder.makeBlock({builder.makeDrop(curr->ref),
                                        builder.makeDrop(curr->value),
                                        builder.makeUnreachable()}));
      // We added an unreachable, and must propagate that type.
      refinalize = true;
      return;
    }

    // Convert the ArraySet into a StructSet.
    // TODO: Handle atomic array accesses.
    replaceCurrent(builder.makeStructSet(
      index, curr->ref, curr->value, MemoryOrder::Unordered));
  }